

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Wrd_t * Gia_ManSimPatSim(Gia_Man_t *pGia)

{
  int iVar1;
  Vec_Wrd_t *vSimsIn;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  int nWords;
  int iVar6;
  Vec_Wrd_t *vSims;
  word *__s;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  word *pwVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  word *pSims;
  
  vSimsIn = pGia->vSimsPi;
  iVar1 = vSimsIn->nSize;
  iVar8 = pGia->vCis->nSize;
  uVar7 = (long)iVar1 / (long)iVar8;
  nWords = (int)uVar7;
  lVar14 = (long)pGia->nObjs * (long)nWords;
  vSims = (Vec_Wrd_t *)malloc(0x10);
  iVar5 = (int)lVar14;
  iVar6 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar6 = iVar5;
  }
  vSims->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar6 << 3);
  }
  vSims->pArray = __s;
  vSims->nSize = iVar5;
  memset(__s,0,lVar14 * 8);
  if (iVar1 % iVar8 == 0) {
    Gia_ManSimPatAssignInputs(pGia,nWords,vSims,vSimsIn);
    iVar1 = pGia->nObjs;
    uVar7 = uVar7 & 0xffffffff;
    if ((0 < (long)iVar1) && (pGVar2 = pGia->pObjs, pGVar2 != (Gia_Obj_t *)0x0)) {
      lVar14 = 0;
      pwVar11 = __s;
      do {
        uVar3 = *(ulong *)(pGVar2 + lVar14);
        uVar12 = (uint)uVar3;
        if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
          uVar15 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)((uint)(uVar3 >> 0x1a) & 8));
          uVar13 = (uint)(uVar3 >> 0x20);
          uVar3 = Cnf_CutDeriveTruth::C[uVar13 >> 0x1d & 1];
          uVar12 = uVar12 & 0x1fffffff;
          uVar13 = uVar13 & 0x1fffffff;
          iVar8 = (int)lVar14;
          if (uVar12 < uVar13) {
            if (0 < nWords) {
              uVar9 = 0;
              do {
                pwVar11[uVar9] =
                     __s[(long)(int)((iVar8 - uVar12) * nWords) + uVar9] ^
                     __s[(long)(int)((iVar8 - uVar13) * nWords) + uVar9] ^ uVar15 ^ uVar3;
                uVar9 = uVar9 + 1;
              } while (uVar7 != uVar9);
            }
          }
          else if (0 < nWords) {
            uVar9 = 0;
            do {
              pwVar11[uVar9] =
                   (__s[(long)(int)((iVar8 - uVar13) * nWords) + uVar9] ^ uVar3) &
                   (__s[(long)(int)((iVar8 - uVar12) * nWords) + uVar9] ^ uVar15);
              uVar9 = uVar9 + 1;
            } while (uVar7 != uVar9);
          }
        }
        lVar14 = lVar14 + 1;
        pwVar11 = pwVar11 + nWords;
      } while (lVar14 != iVar1);
    }
    lVar14 = (long)pGia->vCos->nSize;
    if (0 < lVar14) {
      piVar4 = pGia->vCos->pArray;
      lVar10 = 0;
      do {
        iVar8 = piVar4[lVar10];
        if (((long)iVar8 < 0) || (iVar1 <= iVar8)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGia->pObjs == (Gia_Obj_t *)0x0) {
          return vSims;
        }
        if (0 < nWords) {
          uVar12 = *(uint *)(pGia->pObjs + iVar8);
          uVar3 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)(uVar12 >> 0x1a & 8));
          uVar15 = 0;
          do {
            __s[(long)(iVar8 * nWords) + uVar15] =
                 __s[(long)(int)((iVar8 - (uVar12 & 0x1fffffff)) * nWords) + uVar15] ^ uVar3;
            uVar15 = uVar15 + 1;
          } while (uVar7 != uVar15);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar14);
    }
    return vSims;
  }
  __assert_fail("Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x81,"Vec_Wrd_t *Gia_ManSimPatSim(Gia_Man_t *)");
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatSim( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;
    int i, nWords = Vec_WrdSize(pGia->vSimsPi) / Gia_ManCiNum(pGia);
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords );
    assert( Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0 );
    Gia_ManSimPatAssignInputs( pGia, nWords, vSims, pGia->vSimsPi );
    Gia_ManForEachAnd( pGia, pObj, i ) 
        Gia_ManSimPatSimAnd( pGia, i, pObj, nWords, vSims );
    Gia_ManForEachCo( pGia, pObj, i )
        Gia_ManSimPatSimPo( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
    return vSims;
}